

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

string * __thiscall
lumeview::LoadStringFromFile_abi_cxx11_
          (string *__return_storage_ptr__,lumeview *this,char *filename)

{
  char cVar1;
  ostream *poVar2;
  LumeviewError *this_00;
  stringstream ss;
  ifstream t;
  string local_3d0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  size_type local_3a0;
  undefined8 uStack_398;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(char *)this,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_228,_S_beg);
    cVar1 = std::istream::tellg();
    local_3b0._M_p = (pointer)&local_3a0;
    std::__cxx11::string::_M_construct((ulong)&local_3b0,cVar1);
    std::istream::seekg(local_228,0,0);
    std::istream::read((char *)local_228,(long)local_3b0._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((size_type *)local_3b0._M_p == &local_3a0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_3a0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_398;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_3b0._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_3a0;
    }
    __return_storage_ptr__->_M_string_length = local_3a8;
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3a0,"FILE::LOAD_FROM_STRING",0x16);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Couldn\'t find file ",0x13);
  std::operator<<(poVar2,(char *)this);
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_3d0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

string LoadStringFromFile (const char* filename)
{
	ifstream t(filename);
	COND_THROW (!t, "FILE::LOAD_FROM_STRING" << endl <<
	            "Couldn't find file " << filename);
	t.seekg(0, ios::end);
	size_t size = t.tellg();
	string buffer(size, ' ');
	t.seekg(0);
	t.read(&buffer[0], size);
	return std::move(buffer);
}